

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O2

void raviX_ptrlist_iter_insert(PtrListIterator *self,void *newitem)

{
  int iVar1;
  PtrList *pPVar2;
  C_MemoryAllocator **ppCVar3;
  
  if (-1 < self->__nr) {
    raviX_ptrlist_iter_split_current(self);
    pPVar2 = self->__list;
    iVar1 = self->__nr;
    for (ppCVar3 = (C_MemoryAllocator **)(pPVar2->list_ + (long)*(char *)pPVar2 + -1);
        pPVar2->list_ + iVar1 <= ppCVar3; ppCVar3 = ppCVar3 + -1) {
      ppCVar3[1] = *ppCVar3;
    }
    pPVar2->list_[iVar1] = newitem;
    *(char *)self->__list = *(char *)self->__list + '\x01';
    return;
  }
  __assert_fail("self->__nr >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                ,0x85,"void raviX_ptrlist_iter_insert(PtrListIterator *, void *)");
}

Assistant:

void raviX_ptrlist_iter_insert(PtrListIterator *self, void *newitem)
{
	assert(self->__nr >= 0);
	raviX_ptrlist_iter_split_current(self);
	void **__this = self->__list->list_ + self->__nr;
	void **__last = self->__list->list_ + self->__list->nr_ - 1;
	while (__last >= __this) {
		__last[1] = __last[0];
		__last--;
	}
	*__this = newitem;
	self->__list->nr_++;
}